

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QPainterPath qt_regionToPath(QRegion *region)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  QRegionPrivate *pQVar7;
  undefined8 uVar8;
  qreal qVar9;
  const_iterator pQVar10;
  const_iterator pQVar11;
  ulong uVar12;
  int j;
  uint uVar13;
  const_iterator pQVar14;
  long lVar15;
  int iVar16;
  int i_1;
  double dVar17;
  ulong uVar18;
  int i;
  uint uVar19;
  QRegion *in_RSI;
  long lVar20;
  const_iterator pQVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong in_R10;
  ulong uVar26;
  ulong in_R11;
  long lVar27;
  byte bVar28;
  ulong uVar29;
  qreal *pqVar30;
  byte bVar31;
  undefined8 *puVar32;
  qreal *pqVar33;
  const_iterator pQVar34;
  long lVar35;
  long in_FS_OFFSET;
  QRect QVar36;
  byte local_20bd;
  qreal *local_20b0;
  long local_2090;
  QPointF local_2068;
  QRectF local_2050 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  region->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)region);
  pQVar7 = in_RSI->d->qt_rgn;
  if ((pQVar7 == (QRegionPrivate *)0x0) || (pQVar7->numRects != 1)) {
    pQVar10 = QRegion::begin(in_RSI);
    pQVar11 = QRegion::end(in_RSI);
    pqVar33 = &local_2050[0].h;
    memset(pqVar33,0xaa,0x2000);
    local_2050[0].xp = 1.26480805335359e-321;
    local_2050[0].yp = 0.0;
    dVar17 = (double)((long)pQVar11 - (long)pQVar10 >> 2);
    local_2050[0].w = (qreal)pqVar33;
    if (0x100 < (long)dVar17) {
      local_2068.xp = dVar17;
      local_2050[0].w = (qreal)QtPrivate::fittedMalloc(0,(qsizetype *)&local_2068,0x20,0);
      local_2050[0].xp = local_2068.xp;
    }
    local_2090 = 0;
    local_20b0 = (qreal *)0x0;
    iVar16 = 0;
    pQVar14 = pQVar10;
    uVar13 = 0;
    while (uVar29 = (ulong)uVar13, pQVar14 != pQVar11) {
      iVar1 = (pQVar14->y1).m_i;
      lVar15 = 0;
      lVar27 = 0;
      uVar23 = uVar13;
      uVar24 = uVar13;
      for (pQVar21 = pQVar14; (pQVar21 != pQVar11 && ((pQVar21->y1).m_i == iVar1));
          pQVar21 = pQVar21 + 1) {
        lVar27 = lVar27 + 1;
        uVar23 = uVar23 + 4;
        uVar24 = uVar24 + 2;
        lVar15 = lVar15 + 0x100000000;
      }
      bVar28 = local_20bd & 0xfd;
      bVar31 = (byte)in_R11 & 0xfd;
      uVar18 = in_R10 & 0xfffffffd;
      lVar15 = lVar15 >> 0x20;
      pQVar34 = pQVar10;
      for (lVar20 = 0; lVar27 != lVar20; lVar20 = lVar20 + 1) {
        uVar12 = (int)uVar13 + lVar20;
        uVar8 = *(undefined8 *)(pQVar14 + lVar20);
        *(byte *)((long)local_2050[0].w + uVar12 * 4 * 8) = bVar28;
        *(undefined8 *)((long)local_2050[0].w + uVar12 * 0x20 + 4) = uVar8;
        iVar2 = pQVar14[lVar20].y1.m_i;
        iVar3 = pQVar14[lVar20].x2.m_i;
        lVar25 = uVar12 + lVar15;
        *(char *)((long)local_2050[0].w + lVar25 * 4 * 8) =
             (char)(const_iterator)((ulong)pQVar10 & 0xfffffffd);
        *(ulong *)((long)local_2050[0].w + lVar25 * 0x20 + 4) = CONCAT44(iVar2,iVar3 + 1);
        uVar22._0_4_ = pQVar14[lVar20].x2;
        uVar22._4_4_ = pQVar14[lVar20].y2;
        lVar25 = lVar25 + lVar15;
        *(byte *)((long)local_2050[0].w + lVar25 * 4 * 8) = bVar31;
        *(ulong *)((long)local_2050[0].w + lVar25 * 0x20 + 4) =
             (ulong)((undefined4)uVar22 + 1) | (uVar22 & 0xffffffff00000000) + 0x100000000;
        iVar2 = pQVar14[lVar20].x1.m_i;
        iVar3 = pQVar14[lVar20].y2.m_i;
        *(char *)((long)local_2050[0].w + (lVar25 * 4 + lVar15 * 4) * 8) = (char)uVar18;
        *(ulong *)((long)local_2050[0].w + lVar15 * 0x20 + 4 + lVar25 * 0x20) =
             CONCAT44(iVar3 + 1,iVar2);
        uVar22 = uVar12 & 0xffffffff;
        lVar25 = 0;
        while (lVar25 != 4) {
          lVar35 = lVar25 * lVar27;
          lVar25 = lVar25 + 1;
          uVar26 = (ulong)((uint)lVar27 * ((uint)lVar25 & 3) + (int)uVar12);
          *(qreal **)((long)local_2050[0].w + (lVar35 * 4 + uVar22 * 4 + 3) * 8) =
               (qreal *)((long)local_2050[0].w + uVar26 * 4 * 8);
          *(qreal **)((long)local_2050[0].w + (uVar26 * 4 + 2) * 8) =
               (qreal *)((long)local_2050[0].w + (lVar35 * 4 + uVar22 * 4) * 8);
          *(byte *)((long)local_2050[0].w + (lVar35 * 4 + uVar22 * 4) * 8) =
               *(byte *)((long)local_2050[0].w + (lVar35 * 4 + uVar22 * 4) * 8) & 0xfe |
               *(int *)((long)local_2050[0].w + (lVar35 * 4 + uVar22 * 4 + 1) * 8) ==
               *(int *)((long)local_2050[0].w + (uVar26 * 4 + 1) * 8);
        }
        in_R10 = uVar18;
        in_R11 = (ulong)bVar31;
        pQVar34 = (const_iterator)((ulong)pQVar10 & 0xfffffffd);
        local_20bd = bVar28;
      }
      pQVar10 = pQVar34;
      if ((local_20b0 != (qreal *)0x0) && (iVar16 == iVar1)) {
        uVar19 = 0;
        for (uVar13 = 0; (uVar19 != (uint)local_2090 && (uVar13 != (uint)lVar27));
            uVar13 = uVar13 + (iVar16 <= iVar3)) {
          in_R10 = in_R10 & 0xffffffff;
          uVar18 = (ulong)uVar19;
          uVar22 = (ulong)uVar13;
          iVar16 = *(int *)((long)local_20b0 + uVar18 * 0x20 + 4);
          iVar2 = *(int *)((long)local_20b0[uVar18 * 4 + 3] + 4);
          iVar3 = iVar2;
          if (iVar2 < iVar16) {
            iVar3 = iVar16;
          }
          iVar4 = *(int *)((long)local_2050[0].w + uVar22 * 0x20 + uVar29 * 0x20 + 4);
          qVar9 = *(qreal *)((long)local_2050[0].w + (uVar29 * 4 + uVar22 * 4 + 3) * 8);
          iVar5 = *(int *)((long)qVar9 + 4);
          if (iVar16 < iVar2) {
            iVar2 = iVar16;
          }
          iVar16 = iVar5;
          if (iVar5 < iVar4) {
            iVar16 = iVar4;
          }
          if (iVar4 < iVar5) {
            iVar5 = iVar4;
          }
          if ((iVar2 < iVar16) && (iVar5 < iVar3)) {
            pqVar33 = local_20b0 + uVar18 * 4;
            pqVar30 = (qreal *)((long)local_2050[0].w + (uVar29 * 4 + uVar22 * 4) * 8);
            if (iVar16 < iVar3) {
              pqVar30[3] = local_20b0[uVar18 * 4 + 3];
              *(qreal **)((long)pqVar33[3] + 0x10) = pqVar30;
              pqVar33[3] = qVar9;
              puVar32 = (undefined8 *)((long)qVar9 + 0x10);
            }
            else {
              uVar6 = *(undefined4 *)(pqVar30 + 1);
              lVar15 = (long)pqVar30[2];
              *(undefined8 *)((long)pqVar30 + 4) = *(undefined8 *)((long)pqVar33 + 4);
              lVar20 = (long)pqVar33[2];
              pqVar30[2] = (qreal)lVar20;
              *(qreal **)(lVar20 + 0x18) = pqVar30;
              *(int *)((long)pqVar33 + 4) = iVar4;
              *(undefined4 *)(pqVar33 + 1) = uVar6;
              pqVar33[2] = (qreal)lVar15;
              puVar32 = (undefined8 *)(lVar15 + 0x18);
            }
            *puVar32 = pqVar33;
          }
          uVar19 = uVar19 + (iVar3 <= iVar16);
          in_R11 = in_R11 & 0xffffffff;
          pQVar10 = (const_iterator)((ulong)pQVar34 & 0xff);
        }
      }
      local_20b0 = (qreal *)((long)local_2050[0].w + (ulong)uVar24 * 4 * 8);
      iVar16 = ((iVar1 + (pQVar14->y2).m_i) - (pQVar14->y1).m_i) + 1;
      pQVar14 = pQVar21;
      uVar13 = uVar23;
      local_2090 = lVar27;
    }
    local_2068.xp = local_2050[0].xp;
    local_2050[0].yp = dVar17;
    for (uVar18 = 0; uVar18 != uVar29; uVar18 = uVar18 + 1) {
      if (((ulong)*(qreal *)((long)local_2050[0].w + uVar18 * 4 * 8) & 2) == 0) {
        pqVar30 = (qreal *)((long)local_2050[0].w + uVar18 * 4 * 8);
        local_2068.xp = (qreal)(int)*(undefined8 *)((long)pqVar30 + 4);
        local_2068.yp = (qreal)(int)((ulong)*(undefined8 *)((long)pqVar30 + 4) >> 0x20);
        QPainterPath::moveTo((QPainterPath *)region,&local_2068);
        pqVar33 = pqVar30;
        do {
          bVar28 = *(byte *)pqVar33;
          do {
            *(byte *)pqVar33 = bVar28 | 2;
            pqVar33 = (qreal *)pqVar33[3];
            if (pqVar33 == pqVar30) goto LAB_003d18c1;
            bVar31 = bVar28 ^ *(byte *)pqVar33;
            bVar28 = *(byte *)pqVar33;
          } while ((bVar31 & 1) == 0);
          local_2068.xp = (qreal)(int)*(undefined8 *)((long)pqVar33 + 4);
          local_2068.yp = (qreal)(int)((ulong)*(undefined8 *)((long)pqVar33 + 4) >> 0x20);
          QPainterPath::lineTo((QPainterPath *)region,&local_2068);
        } while( true );
      }
LAB_003d18c1:
    }
    if ((qreal *)local_2050[0].w != &local_2050[0].h) {
      QtPrivate::sizedFree((void *)local_2050[0].w,(long)local_2050[0].xp << 5);
    }
  }
  else {
    QVar36 = QRegion::boundingRect(in_RSI);
    local_2050[0].xp = (qreal)QVar36.x1.m_i.m_i;
    local_2050[0].yp = (qreal)QVar36.y1.m_i.m_i;
    local_2050[0].w = (qreal)(((long)QVar36.x2.m_i.m_i - (long)QVar36.x1.m_i.m_i) + 1);
    local_2050[0].h = (qreal)(((QVar36._8_8_ >> 0x20) - (QVar36._0_8_ >> 0x20)) + 1);
    QPainterPath::addRect((QPainterPath *)region,local_2050);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)region;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QPainterPath qt_regionToPath(const QRegion &region)
{
    QPainterPath result;
    if (region.rectCount() == 1) {
        result.addRect(region.boundingRect());
        return result;
    }

    auto rect = region.begin();
    const auto end = region.end();

    QVarLengthArray<Segment> segments;
    segments.resize(4 * (end - rect));

    int lastRowSegmentCount = 0;
    Segment *lastRowSegments = nullptr;

    int lastSegment = 0;
    int lastY = 0;
    while (rect != end) {
        const int y = rect[0].y();
        int count = 0;
        while (&rect[count] != end && rect[count].y() == y)
            ++count;

        for (int i = 0; i < count; ++i) {
            int offset = lastSegment + i;
            segments[offset] = Segment(rect[i].topLeft());
            segments[offset += count] = Segment(rect[i].topRight() + QPoint(1, 0));
            segments[offset += count] = Segment(rect[i].bottomRight() + QPoint(1, 1));
            segments[offset += count] = Segment(rect[i].bottomLeft() + QPoint(0, 1));

            offset = lastSegment + i;
            for (int j = 0; j < 4; ++j)
                segments[offset + j * count].connect(segments[offset + ((j + 1) % 4) * count]);
        }

        if (lastRowSegments && lastY == y)
            mergeSegments(lastRowSegments, lastRowSegmentCount, &segments[lastSegment], count);

        lastRowSegments = &segments[lastSegment + 2 * count];
        lastRowSegmentCount = count;
        lastSegment += 4 * count;
        lastY = y + rect[0].height();
        rect += count;
    }

    for (int i = 0; i < lastSegment; ++i) {
        Segment *segment = &segments[i];
        if (!segment->added)
            addSegmentsToPath(segment, result);
    }

    return result;
}